

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void drft_init(drft_lookup *l,int n)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  float *pfVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  float *pfVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  
  l->n = n;
  pfVar4 = (float *)calloc((long)(n * 3),4);
  l->trigcache = pfVar4;
  piVar5 = (int *)calloc(0x20,4);
  l->splitcache = piVar5;
  if (n == 1) {
    return;
  }
  iVar10 = 0;
  uVar9 = (ulong)(uint)n;
  uVar13 = 0;
  lVar6 = -1;
  do {
    lVar12 = lVar6 + 1;
    if (lVar6 < 3) {
      iVar10 = (&drfti1_ntryh)[lVar12];
    }
    else {
      iVar10 = iVar10 + 2;
    }
    uVar14 = (uint)uVar13;
    piVar16 = piVar5 + (long)(int)uVar14 + 2;
    uVar2 = (long)(int)uVar14;
    while( true ) {
      uVar13 = uVar2;
      uVar14 = uVar14 + 1;
      uVar2 = (long)(int)uVar9 / (long)iVar10;
      iVar11 = (int)uVar2;
      lVar6 = lVar12;
      if ((int)uVar9 != iVar11 * iVar10) break;
      piVar5[uVar13 + 2] = iVar10;
      if (uVar13 != 0 && iVar10 == 2) {
        if (0 < (long)uVar13) {
          lVar6 = 0;
          do {
            piVar16[lVar6] = piVar16[lVar6 + -1];
            lVar6 = lVar6 + -1;
          } while (1 - (ulong)uVar14 != lVar6);
        }
        piVar5[2] = 2;
      }
      piVar16 = piVar16 + 1;
      uVar9 = uVar2 & 0xffffffff;
      uVar2 = uVar13 + 1;
      if (iVar11 == 1) {
        *piVar5 = n;
        piVar5[1] = (int)(uVar13 + 1);
        if ((long)uVar13 < 1) {
          return;
        }
        uVar9 = 0;
        iVar11 = 0;
        iVar10 = 1;
        do {
          iVar1 = piVar5[uVar9 + 2];
          iVar8 = n / (iVar1 * iVar10);
          if (1 < iVar1) {
            pfVar17 = pfVar4 + (long)n + (long)iVar11;
            iVar15 = 0;
            iVar7 = 0;
            do {
              iVar7 = iVar7 + iVar10;
              if (2 < iVar8) {
                fVar20 = 0.0;
                lVar6 = 1;
                do {
                  fVar20 = fVar20 + 1.0;
                  dVar18 = (double)((float)iVar7 * (6.2831855 / (float)n) * fVar20);
                  dVar19 = cos(dVar18);
                  pfVar17[lVar6 + -1] = (float)dVar19;
                  dVar18 = sin(dVar18);
                  pfVar17[lVar6] = (float)dVar18;
                  iVar3 = (int)lVar6;
                  lVar6 = lVar6 + 2;
                } while (iVar3 + 3 < iVar8);
              }
              iVar15 = iVar15 + 1;
              pfVar17 = pfVar17 + iVar8;
            } while (iVar15 != iVar1 + -1);
            iVar11 = iVar11 + iVar8 * (iVar1 + -1);
          }
          uVar9 = uVar9 + 1;
          iVar10 = iVar1 * iVar10;
        } while (uVar9 != (uVar13 & 0xffffffff));
        return;
      }
    }
  } while( true );
}

Assistant:

void drft_init(drft_lookup *l,int n){
  l->n=n;
  l->trigcache=_ogg_calloc(3*n,sizeof(*l->trigcache));
  l->splitcache=_ogg_calloc(32,sizeof(*l->splitcache));
  fdrffti(n, l->trigcache, l->splitcache);
}